

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O3

void __thiscall
TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this)

{
  pointer *__ptr;
  database *pdVar1;
  char *pcVar2;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  typed_address<pstore::trailer> local_70;
  undefined1 local_68 [8];
  database *local_60;
  lock_guard<pstore::transaction_mutex> local_40;
  
  pdVar1 = &(this->super_TwoConnections).first;
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)local_68,pdVar1);
  anon_unknown.dwarf_463a9f::append_int((transaction_base *)local_68,(int)pdVar1);
  pstore::transaction_base::commit((transaction_base *)local_68);
  local_68 = (undefined1  [8])&PTR__transaction_0026c668;
  pstore::transaction_base::rollback((transaction_base *)local_68);
  pstore::lock_guard<pstore::transaction_mutex>::~lock_guard(&local_40);
  pdVar1 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).first.size_.footer_pos_.a_.a_;
  local_70.a_.a_ = (address)(this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_68,"first.footer_pos ()","second.footer_pos ()",
             (typed_address<pstore::trailer> *)&local_78,&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_60 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_68,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,(unsigned_long *)&local_78);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_60 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).first.size_.footer_pos_.a_.a_;
  local_70.a_.a_ = (address)(this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_68,"first.footer_pos ()","second.footer_pos ()",
             (typed_address<pstore::trailer> *)&local_78,&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_60 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_68,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,(unsigned_long *)&local_78);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_60 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionUpdatesFooterPos) {
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    second.sync ();
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    second.sync (1U);
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
}